

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void forget_levels(int percent)

{
  trap *ptVar1;
  xchar xVar2;
  xchar xVar3;
  xchar xVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int indices [512];
  int local_838 [514];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_levels: bad percent %d",(ulong)(uint)percent);
      return;
    }
    xVar2 = ledger_no(&u.uz);
    xVar3 = maxledgerno();
    if (xVar3 < '\0') {
      iVar7 = 0;
    }
    else {
      uVar11 = 0;
      iVar7 = 0;
      do {
        if (((levels[uVar11] != (level *)0x0) && (((levels[uVar11]->flags).field_0xa & 0x40) == 0))
           && ((uint)(int)xVar2 != uVar11)) {
          xVar4 = ledger_to_dnum((xchar)uVar11);
          if (xVar4 == dungeon_topology.d_sokoban_dnum) {
            percent = percent + 2;
          }
          else {
            lVar9 = (long)iVar7;
            iVar7 = iVar7 + 1;
            local_838[lVar9] = (int)uVar11;
          }
        }
        uVar11 = uVar11 + 1;
      } while ((byte)(xVar3 + 1) != uVar11);
    }
    iVar12 = 100;
    if (percent < 100) {
      iVar12 = percent;
    }
    randomize(local_838,iVar7);
    if (0x31 < iVar12 * iVar7) {
      uVar5 = (iVar12 * iVar7 + 0x32U) / 100;
      uVar11 = 1;
      if (1 < uVar5) {
        uVar11 = (ulong)uVar5;
      }
      uVar6 = 0;
      do {
        iVar7 = local_838[uVar6];
        puVar8 = &(levels[iVar7]->flags).field_0x8;
        *(uint *)puVar8 = *(uint *)puVar8 | 0x400000;
        if ((levels[iVar7]->z).dnum != dungeon_topology.d_sokoban_dnum) {
          puVar8 = &levels[iVar7]->locations[0][0].field_0x6;
          lVar9 = 0;
          do {
            lVar10 = 0;
            do {
              puVar8[lVar10 + -1] = 0;
              *(undefined4 *)(puVar8 + lVar10 + -6) = 0;
              *(uint *)(puVar8 + lVar10) = *(uint *)(puVar8 + lVar10) & 0xfffff7f3;
              lVar10 = lVar10 + 0xc;
            } while (lVar10 != 0xfc);
            lVar9 = lVar9 + 1;
            puVar8 = puVar8 + 0xfc;
          } while (lVar9 != 0x50);
        }
        xVar3 = u.uy;
        xVar2 = u.ux;
        for (ptVar1 = levels[iVar7]->lev_traps; ptVar1 != (trap *)0x0; ptVar1 = ptVar1->ntrap) {
          if (((ptVar1->tx != xVar2) || (ptVar1->ty != xVar3)) &&
             ((ptVar1->field_0x8 & 0x1f) != 0xd)) {
            ptVar1->field_0x8 = ptVar1->field_0x8 & 0xdf;
          }
        }
        levels[iVar7]->levname[0] = '\0';
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar11);
    }
  }
  return;
}

Assistant:

void forget_levels(int percent)
{
	int i, count;
	xchar  maxl, this_lev;
	int indices[MAXLINFO];

	if (percent == 0) return;

	if (percent <= 0 || percent > 100) {
	    impossible("forget_levels: bad percent %d", percent);
	    return;
	}

	this_lev = ledger_no(&u.uz);
	maxl = maxledgerno();

	/* count & save indices of non-forgotten visited levels */
	/* Sokoban levels are pre-mapped for the player, and should stay
	 * so, or they become nearly impossible to solve.  But try to
	 * shift the forgetting elsewhere by fiddling with percent
	 * instead of forgetting fewer levels.
	 */
	for (count = 0, i = 0; i <= maxl; i++)
	    if ((levels[i] && !levels[i]->flags.forgotten) && i != this_lev) {
		if (ledger_to_dnum(i) == sokoban_dnum)
		    percent += 2;
		else
		    indices[count++] = i;
	    }
	
	if (percent > 100) percent = 100;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++) {
	    levels[indices[i]]->flags.forgotten = TRUE;
	    forget_map(levels[indices[i]], TRUE);
	    forget_traps(levels[indices[i]]);
	    levels[indices[i]]->levname[0] = '\0';
	}
}